

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx2.cpp
# Opt level: O2

void __thiscall ncnn::LSTM_x86_avx2::LSTM_x86_avx2(LSTM_x86_avx2 *this)

{
  LSTM::LSTM((LSTM *)&this->field_0x98);
  this->_vptr_LSTM_x86_avx2 = (_func_int **)0x32b198;
  *(undefined8 *)&this->field_0x98 = 0x32b218;
  (this->weight_hc_data_fp16).data = (void *)0x0;
  (this->weight_hc_data_fp16).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_hc_data_fp16).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_hc_data_fp16).elemsize + 4) = 0;
  (this->weight_hc_data_fp16).allocator = (Allocator *)0x0;
  (this->weight_hc_data_fp16).dims = 0;
  (this->weight_hc_data_fp16).w = 0;
  (this->weight_hc_data_fp16).w = 0;
  (this->weight_hc_data_fp16).h = 0;
  (this->weight_hc_data_fp16).d = 0;
  (this->weight_hc_data_fp16).c = 0;
  (this->weight_xc_data_fp16).cstep = 0;
  (this->weight_xc_data_fp16).allocator = (Allocator *)0x0;
  (this->weight_xc_data_fp16).dims = 0;
  (this->weight_xc_data_fp16).w = 0;
  (this->weight_xc_data_fp16).w = 0;
  (this->weight_xc_data_fp16).h = 0;
  (this->weight_xc_data_fp16).d = 0;
  (this->weight_xc_data_fp16).c = 0;
  *(undefined1 (*) [32])&(this->weight_hc_data_fp16).cstep = ZEXT432(0) << 0x40;
  (this->weight_xc_data_fp16).elempack = 0;
  this->field_0xa9 = 1;
  *(undefined2 *)&this->field_0xa0 = 0;
  return;
}

Assistant:

LSTM_x86_avx2::LSTM_x86_avx2()
{
#ifdef __AVX2__
    support_weight_fp16_storage = true;
#endif
    one_blob_only = false;
    support_inplace = false;
}